

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

void LinkLibraryTypeSpecifierWarning(cmMakefile *mf,int left,int right)

{
  char *__s;
  char *__s_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_98;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  
  __s = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)(uint)left * 8);
  local_68 = strlen(__s);
  local_78._M_len = 0x1d;
  local_78._M_str = "Link library type specifier \"";
  local_58 = 0x1c;
  local_50 = "\" is followed by specifier \"";
  __s_00 = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)(uint)right * 8);
  local_60 = __s;
  local_48 = strlen(__s_00);
  local_38 = 0x42;
  local_30 = "\" instead of a library name.  The first specifier will be ignored.";
  views._M_len = 5;
  views._M_array = &local_78;
  local_40 = __s_00;
  cmCatViews_abi_cxx11_(&local_98,views);
  cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void LinkLibraryTypeSpecifierWarning(cmMakefile& mf, int left,
                                            int right)
{
  mf.IssueMessage(
    MessageType::AUTHOR_WARNING,
    cmStrCat(
      "Link library type specifier \"", LinkLibraryTypeNames[left],
      "\" is followed by specifier \"", LinkLibraryTypeNames[right],
      "\" instead of a library name.  The first specifier will be ignored."));
}